

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O3

iter_type __thiscall
booster::locale::util::base_num_format<char>::format_currency<true>
          (base_num_format<char> *this,iter_type out,ios_base *ios,char_type fill,longdouble val)

{
  undefined1 auVar1 [12];
  int iVar2;
  uint uVar3;
  moneypunct *pmVar4;
  money_put *pmVar5;
  iter_type iVar6;
  locale loc;
  locale local_40;
  longdouble local_34;
  
  local_34 = val;
  std::locale::locale(&local_40,(locale *)(ios + 0xd0));
  pmVar4 = std::use_facet<std::__cxx11::moneypunct<char,true>>(&local_40);
  iVar2 = (**(code **)(*(long *)pmVar4 + 0x40))(pmVar4);
  if (0 < iVar2) {
    uVar3 = iVar2 + 1;
    do {
      local_34 = local_34 * (longdouble)10.0;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  uVar3 = *(uint *)(ios + 0x18);
  *(uint *)(ios + 0x18) = uVar3 | 0x200;
  pmVar5 = std::
           use_facet<std::__cxx11::money_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>>
                     (&local_40);
  auVar1 = (**(code **)(*(long *)pmVar5 + 0x10))
                     (pmVar5,out._M_sbuf,out._8_4_ & 0xff,1,ios,(int)fill,local_34);
  *(uint *)(ios + 0x18) = uVar3;
  std::locale::~locale(&local_40);
  iVar6._12_4_ = 0;
  iVar6._M_sbuf = (streambuf_type *)auVar1._0_8_;
  iVar6._M_failed = (bool)auVar1[8];
  iVar6._9_3_ = auVar1._9_3_;
  return iVar6;
}

Assistant:

iter_type format_currency(iter_type out,std::ios_base &ios,char_type fill,long double val) const
    {
        std::locale loc = ios.getloc();
        int digits = std::use_facet<std::moneypunct<char_type,intl> >(loc).frac_digits();
        while(digits > 0) {
            val*=10;
            digits --;
        }
        std::ios_base::fmtflags f=ios.flags();
        ios.flags(f | std::ios_base::showbase);
        out = std::use_facet<std::money_put<char_type> >(loc).put(out,intl,ios,fill,val);
        ios.flags(f);
        return out;
    }